

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 (*pauVar20) [16];
  int iVar21;
  undefined4 uVar22;
  undefined1 (*pauVar23) [16];
  long lVar24;
  long lVar25;
  undefined4 uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  vint4 ai_1;
  undefined1 auVar45 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  float fVar47;
  float fVar56;
  float fVar57;
  vint4 ai;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar49 [32];
  undefined1 auVar48 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar58;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  vint4 ai_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar71;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  vint4 ai_2;
  undefined1 auVar72 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  __m128 a_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  vint4 bi_1;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  uint uVar108;
  uint uVar109;
  uint uVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar107 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_13f0;
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [32];
  undefined8 local_1380;
  uint uStack_1378;
  uint uStack_1374;
  uint uStack_1370;
  uint uStack_136c;
  uint uStack_1368;
  uint uStack_1364;
  undefined8 local_1360;
  uint uStack_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar122 [32];
  
  pauVar23 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar61 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_13b0._4_4_ = fVar61;
  local_13b0._0_4_ = fVar61;
  local_13b0._8_4_ = fVar61;
  local_13b0._12_4_ = fVar61;
  auVar98 = ZEXT1664(local_13b0);
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_13c0._4_4_ = fVar47;
  local_13c0._0_4_ = fVar47;
  local_13c0._8_4_ = fVar47;
  local_13c0._12_4_ = fVar47;
  auVar100 = ZEXT1664(local_13c0);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_12d0._4_4_ = fVar56;
  local_12d0._0_4_ = fVar56;
  local_12d0._8_4_ = fVar56;
  local_12d0._12_4_ = fVar56;
  auVar103 = ZEXT1664(local_12d0);
  fVar61 = fVar61 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar56 = fVar56 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar21 = (tray->tfar).field_0.i[k];
  auVar106 = ZEXT1664(CONCAT412(iVar21,CONCAT48(iVar21,CONCAT44(iVar21,iVar21))));
  auVar89._0_8_ = CONCAT44(fVar61,fVar61) ^ 0x8000000080000000;
  auVar89._8_4_ = -fVar61;
  auVar89._12_4_ = -fVar61;
  local_12e0._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_12e0._8_4_ = -fVar47;
  local_12e0._12_4_ = -fVar47;
  auVar116 = ZEXT1664(local_12e0);
  local_12f0._0_8_ = CONCAT44(fVar56,fVar56) ^ 0x8000000080000000;
  local_12f0._8_4_ = -fVar56;
  local_12f0._12_4_ = -fVar56;
  auVar119 = ZEXT1664(local_12f0);
  iVar21 = (tray->tnear).field_0.i[k];
  local_1300._4_4_ = iVar21;
  local_1300._0_4_ = iVar21;
  local_1300._8_4_ = iVar21;
  local_1300._12_4_ = iVar21;
  auVar123 = ZEXT1664(local_1300);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar21 = 1 << ((uint)k & 0x1f);
  auVar93._4_4_ = iVar21;
  auVar93._0_4_ = iVar21;
  auVar93._8_4_ = iVar21;
  auVar93._12_4_ = iVar21;
  auVar93._16_4_ = iVar21;
  auVar93._20_4_ = iVar21;
  auVar93._24_4_ = iVar21;
  auVar93._28_4_ = iVar21;
  auVar45 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar93 = vpand_avx2(auVar93,auVar45);
  local_10e0 = vpcmpeqd_avx2(auVar93,auVar45);
  auVar45._8_4_ = 0xbf800000;
  auVar45._0_8_ = 0xbf800000bf800000;
  auVar45._12_4_ = 0xbf800000;
  auVar45._16_4_ = 0xbf800000;
  auVar45._20_4_ = 0xbf800000;
  auVar45._24_4_ = 0xbf800000;
  auVar45._28_4_ = 0xbf800000;
  auVar49._8_4_ = 0x3f800000;
  auVar49._0_8_ = 0x3f8000003f800000;
  auVar49._12_4_ = 0x3f800000;
  auVar49._16_4_ = 0x3f800000;
  auVar49._20_4_ = 0x3f800000;
  auVar49._24_4_ = 0x3f800000;
  auVar49._28_4_ = 0x3f800000;
  _local_1120 = vblendvps_avx(auVar49,auVar45,local_1100);
LAB_005998e2:
  do {
    pauVar20 = pauVar23 + -1;
    pauVar23 = pauVar23 + -1;
    if (*(float *)(*pauVar20 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      local_12c0 = auVar106._0_16_;
      uVar42 = *(ulong *)*pauVar23;
      while ((uVar42 & 8) == 0) {
        auVar88 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar38),auVar89,
                                  auVar98._0_16_);
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar39),auVar116._0_16_,
                                  auVar100._0_16_);
        auVar88 = vpmaxsd_avx(auVar88,auVar48);
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar40),auVar119._0_16_,
                                  auVar103._0_16_);
        auVar62 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar38 ^ 0x10)),auVar89,
                                  auVar98._0_16_);
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar39 ^ 0x10)),
                                  auVar116._0_16_,auVar100._0_16_);
        auVar62 = vpminsd_avx(auVar62,auVar43);
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar40 ^ 0x10)),
                                  auVar119._0_16_,auVar103._0_16_);
        auVar48 = vpmaxsd_avx(auVar48,auVar123._0_16_);
        auVar48 = vpmaxsd_avx(auVar88,auVar48);
        auVar88 = vpminsd_avx(auVar43,local_12c0);
        auVar88 = vpminsd_avx(auVar62,auVar88);
        auVar88 = vpcmpgtd_avx(auVar48,auVar88);
        iVar21 = vmovmskps_avx(auVar88);
        local_12a0._0_16_ = auVar48;
        if (iVar21 == 0xf) {
          if (pauVar23 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_005998e2;
        }
        bVar30 = (byte)iVar21 ^ 0xf;
        uVar27 = uVar42 & 0xfffffffffffffff0;
        lVar25 = 0;
        for (uVar42 = (ulong)bVar30; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar42 = *(ulong *)(uVar27 + lVar25 * 8);
        uVar31 = bVar30 - 1 & (uint)bVar30;
        uVar29 = (ulong)uVar31;
        if (uVar31 != 0) {
          uVar32 = *(uint *)(local_12a0 + lVar25 * 4);
          lVar25 = 0;
          for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar31 = uVar31 - 1 & uVar31;
          uVar36 = (ulong)uVar31;
          uVar29 = *(ulong *)(uVar27 + lVar25 * 8);
          uVar33 = *(uint *)(local_12a0 + lVar25 * 4);
          if (uVar31 == 0) {
            if (uVar32 < uVar33) {
              *(ulong *)*pauVar23 = uVar29;
              *(uint *)(*pauVar23 + 8) = uVar33;
              pauVar23 = pauVar23 + 1;
            }
            else {
              *(ulong *)*pauVar23 = uVar42;
              *(uint *)(*pauVar23 + 8) = uVar32;
              pauVar23 = pauVar23 + 1;
              uVar42 = uVar29;
            }
          }
          else {
            auVar88._8_8_ = 0;
            auVar88._0_8_ = uVar42;
            auVar88 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar32));
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar29;
            auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar33));
            lVar25 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar42 = (ulong)uVar31;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
            auVar43 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_12a0 + lVar25 * 4)));
            auVar62 = vpcmpgtd_avx(auVar48,auVar88);
            if (uVar31 == 0) {
              auVar84 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar48,auVar88,auVar84);
              auVar88 = vblendvps_avx(auVar88,auVar48,auVar84);
              auVar48 = vpcmpgtd_avx(auVar43,auVar62);
              auVar84 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar43,auVar62,auVar84);
              auVar62 = vblendvps_avx(auVar62,auVar43,auVar84);
              auVar43 = vpcmpgtd_avx(auVar62,auVar88);
              auVar84 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar62,auVar88,auVar84);
              auVar88 = vblendvps_avx(auVar88,auVar62,auVar84);
              *pauVar23 = auVar88;
              pauVar23[1] = auVar43;
              uVar42 = auVar48._0_8_;
              pauVar23 = pauVar23 + 2;
            }
            else {
              lVar25 = 0;
              for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
              auVar84._8_8_ = 0;
              auVar84._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
              auVar44 = vpunpcklqdq_avx(auVar84,ZEXT416(*(uint *)(local_12a0 + lVar25 * 4)));
              auVar84 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar48,auVar88,auVar84);
              auVar88 = vblendvps_avx(auVar88,auVar48,auVar84);
              auVar48 = vpcmpgtd_avx(auVar44,auVar43);
              auVar84 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar44,auVar43,auVar84);
              auVar43 = vblendvps_avx(auVar43,auVar44,auVar84);
              auVar84 = vpcmpgtd_avx(auVar43,auVar88);
              auVar44 = vpshufd_avx(auVar84,0xaa);
              auVar84 = vblendvps_avx(auVar43,auVar88,auVar44);
              auVar88 = vblendvps_avx(auVar88,auVar43,auVar44);
              auVar43 = vpcmpgtd_avx(auVar48,auVar62);
              auVar44 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar48,auVar62,auVar44);
              auVar48 = vblendvps_avx(auVar62,auVar48,auVar44);
              auVar62 = vpcmpgtd_avx(auVar84,auVar48);
              auVar44 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar84,auVar48,auVar44);
              auVar48 = vblendvps_avx(auVar48,auVar84,auVar44);
              *pauVar23 = auVar88;
              pauVar23[1] = auVar48;
              pauVar23[2] = auVar62;
              uVar42 = auVar43._0_8_;
              pauVar23 = pauVar23 + 3;
            }
          }
        }
      }
      uVar27 = (ulong)((uint)uVar42 & 0xf);
      if (uVar27 != 8) {
        uVar42 = uVar42 & 0xfffffffffffffff0;
        lVar25 = 0;
        do {
          lVar24 = lVar25 * 0x58;
          lVar1 = lVar24 + uVar42;
          uVar22 = *(undefined4 *)(uVar42 + 0x38 + lVar24);
          auVar63._4_4_ = uVar22;
          auVar63._0_4_ = uVar22;
          auVar63._8_4_ = uVar22;
          auVar63._12_4_ = uVar22;
          uVar22 = *(undefined4 *)(uVar42 + 0x44 + lVar24);
          auVar72._4_4_ = uVar22;
          auVar72._0_4_ = uVar22;
          auVar72._8_4_ = uVar22;
          auVar72._12_4_ = uVar22;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)((uVar38 >> 2) + 0x20 + lVar1);
          auVar88 = vpmovzxbd_avx(auVar43);
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar62 = vfmadd213ps_fma(auVar88,auVar72,auVar63);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(((uVar38 ^ 0x10) >> 2) + 0x20 + lVar1);
          auVar88 = vpmovzxbd_avx(auVar44);
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar43 = vfmadd213ps_fma(auVar88,auVar72,auVar63);
          uVar22 = *(undefined4 *)(uVar42 + 0x3c + lVar24);
          auVar85._4_4_ = uVar22;
          auVar85._0_4_ = uVar22;
          auVar85._8_4_ = uVar22;
          auVar85._12_4_ = uVar22;
          uVar22 = *(undefined4 *)(uVar42 + 0x48 + lVar24);
          auVar90._4_4_ = uVar22;
          auVar90._0_4_ = uVar22;
          auVar90._8_4_ = uVar22;
          auVar90._12_4_ = uVar22;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)((uVar39 >> 2) + 0x20 + lVar1);
          auVar88 = vpmovzxbd_avx(auVar64);
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar84 = vfmadd213ps_fma(auVar88,auVar90,auVar85);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(((uVar39 ^ 0x10) >> 2) + 0x20 + lVar1);
          auVar88 = vpmovzxbd_avx(auVar65);
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar44 = vfmadd213ps_fma(auVar88,auVar90,auVar85);
          uVar22 = *(undefined4 *)(uVar42 + 0x40 + lVar24);
          auVar86._4_4_ = uVar22;
          auVar86._0_4_ = uVar22;
          auVar86._8_4_ = uVar22;
          auVar86._12_4_ = uVar22;
          uVar22 = *(undefined4 *)(uVar42 + 0x4c + lVar24);
          auVar91._4_4_ = uVar22;
          auVar91._0_4_ = uVar22;
          auVar91._8_4_ = uVar22;
          auVar91._12_4_ = uVar22;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)((uVar40 >> 2) + 0x20 + lVar1);
          auVar88 = vpmovzxbd_avx(auVar94);
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar63 = vfmadd213ps_fma(auVar88,auVar91,auVar86);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)(((uVar40 ^ 0x10) >> 2) + 0x20 + lVar1);
          auVar88 = vpmovzxbd_avx(auVar99);
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar64 = vfmadd213ps_fma(auVar88,auVar91,auVar86);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)(uVar42 + 0x20 + lVar24);
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)(uVar42 + 0x24 + lVar24);
          auVar48 = vpminub_avx(auVar87,auVar92);
          auVar88 = vpcmpeqb_avx(auVar87,auVar48);
          auVar48 = vpcmpeqd_avx(auVar48,auVar48);
          auVar88 = vpmovzxbd_avx(auVar88 ^ auVar48);
          auVar88 = vpslld_avx(auVar88 ^ auVar48,0x1f);
          uVar22 = vmovmskps_avx(auVar88);
          auVar88 = vfmadd213ps_fma(auVar62,local_13b0,auVar89);
          auVar48 = vfmadd213ps_fma(auVar84,local_13c0,auVar116._0_16_);
          auVar88 = vpmaxsd_avx(auVar88,auVar48);
          auVar48 = vfmadd213ps_fma(auVar43,local_13b0,auVar89);
          auVar62 = vfmadd213ps_fma(auVar44,local_13c0,auVar116._0_16_);
          auVar62 = vpminsd_avx(auVar48,auVar62);
          auVar48 = vfmadd213ps_fma(auVar63,auVar103._0_16_,auVar119._0_16_);
          auVar48 = vpmaxsd_avx(auVar48,auVar123._0_16_);
          local_12b0 = vpmaxsd_avx(auVar88,auVar48);
          auVar88 = vfmadd213ps_fma(auVar64,auVar103._0_16_,auVar119._0_16_);
          auVar88 = vpminsd_avx(auVar88,auVar106._0_16_);
          auVar88 = vpminsd_avx(auVar62,auVar88);
          auVar88 = vpcmpgtd_avx(local_12b0,auVar88);
          uVar26 = vmovmskps_avx(auVar88);
          bVar30 = ~(byte)uVar26 & (byte)uVar22;
          if (bVar30 != 0) {
            uVar29 = (ulong)bVar30;
            do {
              lVar24 = 0;
              for (uVar36 = uVar29; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                lVar24 = lVar24 + 1;
              }
              fVar61 = *(float *)(ray + k * 4 + 0x100);
              if (*(float *)(local_12b0 + lVar24 * 4) <= fVar61) {
                uVar3 = *(ushort *)(lVar1 + lVar24 * 8);
                uVar4 = *(ushort *)(lVar1 + 2 + lVar24 * 8);
                uStack_1358 = *(uint *)(lVar1 + 0x50);
                uStack_1378 = *(uint *)(lVar1 + 4 + lVar24 * 8);
                pGVar5 = (context->scene->geometries).items[uStack_1358].ptr;
                lVar24 = *(long *)&pGVar5->field_0x58;
                lVar37 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                         * (ulong)uStack_1378;
                uVar32 = uVar3 & 0x7fff;
                uVar33 = uVar4 & 0x7fff;
                uVar31 = *(uint *)(lVar24 + 4 + lVar37);
                uVar41 = (ulong)uVar31;
                uVar28 = (ulong)(uVar31 * uVar33 + *(int *)(lVar24 + lVar37) + uVar32);
                p_Var6 = pGVar5[1].intersectionFilterN;
                lVar7 = *(long *)&pGVar5[1].time_range.upper;
                auVar88 = *(undefined1 (*) [16])(lVar7 + (uVar28 + 1) * (long)p_Var6);
                auVar48 = *(undefined1 (*) [16])(lVar7 + (uVar28 + uVar41) * (long)p_Var6);
                lVar34 = uVar28 + uVar41 + 1;
                auVar62 = *(undefined1 (*) [16])(lVar7 + lVar34 * (long)p_Var6);
                auVar43 = *(undefined1 (*) [16])
                           (lVar7 + (uVar28 + (-1 < (short)uVar3) + 1) * (long)p_Var6);
                lVar35 = (ulong)(-1 < (short)uVar3) + lVar34;
                auVar84 = *(undefined1 (*) [16])(lVar7 + lVar35 * (long)p_Var6);
                uVar36 = 0;
                if (-1 < (short)uVar4) {
                  uVar36 = uVar41;
                }
                auVar44 = *(undefined1 (*) [16])(lVar7 + (uVar28 + uVar41 + uVar36) * (long)p_Var6);
                auVar63 = *(undefined1 (*) [16])(lVar7 + (lVar34 + uVar36) * (long)p_Var6);
                auVar104._16_16_ = *(undefined1 (*) [16])(lVar7 + (uVar36 + lVar35) * (long)p_Var6);
                auVar104._0_16_ = auVar62;
                auVar65 = vunpcklps_avx(auVar88,auVar84);
                auVar64 = vunpckhps_avx(auVar88,auVar84);
                auVar72 = vunpcklps_avx(auVar43,auVar62);
                auVar43 = vunpckhps_avx(auVar43,auVar62);
                auVar85 = vunpcklps_avx(auVar64,auVar43);
                auVar86 = vunpcklps_avx(auVar65,auVar72);
                auVar43 = vunpckhps_avx(auVar65,auVar72);
                auVar65 = vunpcklps_avx(auVar48,auVar63);
                auVar64 = vunpckhps_avx(auVar48,auVar63);
                auVar72 = vunpcklps_avx(auVar62,auVar44);
                auVar44 = vunpckhps_avx(auVar62,auVar44);
                auVar64 = vunpcklps_avx(auVar64,auVar44);
                auVar87 = vunpcklps_avx(auVar65,auVar72);
                auVar44 = vunpckhps_avx(auVar65,auVar72);
                auVar73._16_16_ = auVar63;
                auVar73._0_16_ = auVar48;
                auVar67._16_16_ = auVar84;
                auVar67._0_16_ = auVar88;
                auVar93 = vunpcklps_avx(auVar67,auVar73);
                auVar50._16_16_ = auVar62;
                auVar50._0_16_ = *(undefined1 (*) [16])(lVar7 + (long)p_Var6 * uVar28);
                auVar45 = vunpcklps_avx(auVar50,auVar104);
                auVar12 = vunpcklps_avx(auVar45,auVar93);
                auVar11 = vunpckhps_avx(auVar45,auVar93);
                auVar93 = vunpckhps_avx(auVar67,auVar73);
                auVar45 = vunpckhps_avx(auVar50,auVar104);
                auVar67 = vunpcklps_avx(auVar45,auVar93);
                auVar51._16_16_ = auVar86;
                auVar51._0_16_ = auVar86;
                auVar68._16_16_ = auVar43;
                auVar68._0_16_ = auVar43;
                auVar96._16_16_ = auVar85;
                auVar96._0_16_ = auVar85;
                auVar101._16_16_ = auVar87;
                auVar101._0_16_ = auVar87;
                auVar114._16_16_ = auVar44;
                auVar114._0_16_ = auVar44;
                auVar117._16_16_ = auVar64;
                auVar117._0_16_ = auVar64;
                auVar45 = vsubps_avx(auVar12,auVar51);
                auVar93 = vsubps_avx(auVar11,auVar68);
                auVar49 = vsubps_avx(auVar67,auVar96);
                auVar50 = vsubps_avx(auVar101,auVar12);
                auVar9 = vsubps_avx(auVar114,auVar11);
                auVar10 = vsubps_avx(auVar117,auVar67);
                auVar13._4_4_ = auVar93._4_4_ * auVar10._4_4_;
                auVar13._0_4_ = auVar93._0_4_ * auVar10._0_4_;
                auVar13._8_4_ = auVar93._8_4_ * auVar10._8_4_;
                auVar13._12_4_ = auVar93._12_4_ * auVar10._12_4_;
                auVar13._16_4_ = auVar93._16_4_ * auVar10._16_4_;
                auVar13._20_4_ = auVar93._20_4_ * auVar10._20_4_;
                auVar13._24_4_ = auVar93._24_4_ * auVar10._24_4_;
                auVar13._28_4_ = auVar86._12_4_;
                auVar84 = vfmsub231ps_fma(auVar13,auVar9,auVar49);
                auVar14._4_4_ = auVar49._4_4_ * auVar50._4_4_;
                auVar14._0_4_ = auVar49._0_4_ * auVar50._0_4_;
                auVar14._8_4_ = auVar49._8_4_ * auVar50._8_4_;
                auVar14._12_4_ = auVar49._12_4_ * auVar50._12_4_;
                auVar14._16_4_ = auVar49._16_4_ * auVar50._16_4_;
                auVar14._20_4_ = auVar49._20_4_ * auVar50._20_4_;
                auVar14._24_4_ = auVar49._24_4_ * auVar50._24_4_;
                auVar14._28_4_ = auVar43._12_4_;
                auVar43 = vfmsub231ps_fma(auVar14,auVar10,auVar45);
                uVar22 = *(undefined4 *)(ray + k * 4);
                auVar121._4_4_ = uVar22;
                auVar121._0_4_ = uVar22;
                auVar121._8_4_ = uVar22;
                auVar121._12_4_ = uVar22;
                auVar121._16_4_ = uVar22;
                auVar121._20_4_ = uVar22;
                auVar121._24_4_ = uVar22;
                auVar121._28_4_ = uVar22;
                uVar22 = *(undefined4 *)(ray + k * 4 + 0x20);
                auVar124._4_4_ = uVar22;
                auVar124._0_4_ = uVar22;
                auVar124._8_4_ = uVar22;
                auVar124._12_4_ = uVar22;
                auVar124._16_4_ = uVar22;
                auVar124._20_4_ = uVar22;
                auVar124._24_4_ = uVar22;
                auVar124._28_4_ = uVar22;
                uVar22 = *(undefined4 *)(ray + k * 4 + 0x40);
                auVar126._4_4_ = uVar22;
                auVar126._0_4_ = uVar22;
                auVar126._8_4_ = uVar22;
                auVar126._12_4_ = uVar22;
                auVar126._16_4_ = uVar22;
                auVar126._20_4_ = uVar22;
                auVar126._24_4_ = uVar22;
                auVar126._28_4_ = uVar22;
                fVar47 = *(float *)(ray + k * 4 + 0x80);
                auVar115._4_4_ = fVar47;
                auVar115._0_4_ = fVar47;
                auVar115._8_4_ = fVar47;
                auVar115._12_4_ = fVar47;
                auVar115._16_4_ = fVar47;
                auVar115._20_4_ = fVar47;
                auVar115._24_4_ = fVar47;
                auVar115._28_4_ = fVar47;
                auVar12 = vsubps_avx(auVar12,auVar121);
                fVar56 = *(float *)(ray + k * 4 + 0xa0);
                auVar120._4_4_ = fVar56;
                auVar120._0_4_ = fVar56;
                auVar120._8_4_ = fVar56;
                auVar120._12_4_ = fVar56;
                auVar122._16_4_ = fVar56;
                auVar122._0_16_ = auVar120;
                auVar122._20_4_ = fVar56;
                auVar122._24_4_ = fVar56;
                auVar122._28_4_ = fVar56;
                auVar11 = vsubps_avx(auVar11,auVar124);
                fVar111 = *(float *)(ray + k * 4 + 0xc0);
                auVar125._4_4_ = fVar111;
                auVar125._0_4_ = fVar111;
                auVar125._8_4_ = fVar111;
                auVar125._12_4_ = fVar111;
                auVar125._16_4_ = fVar111;
                auVar125._20_4_ = fVar111;
                auVar125._24_4_ = fVar111;
                auVar125._28_4_ = fVar111;
                auVar67 = vsubps_avx(auVar67,auVar126);
                auVar15._4_4_ = fVar47 * auVar11._4_4_;
                auVar15._0_4_ = fVar47 * auVar11._0_4_;
                auVar15._8_4_ = fVar47 * auVar11._8_4_;
                auVar15._12_4_ = fVar47 * auVar11._12_4_;
                auVar15._16_4_ = fVar47 * auVar11._16_4_;
                auVar15._20_4_ = fVar47 * auVar11._20_4_;
                auVar15._24_4_ = fVar47 * auVar11._24_4_;
                auVar15._28_4_ = uVar22;
                auVar88 = vfmsub231ps_fma(auVar15,auVar12,auVar122);
                auVar16._4_4_ = auVar10._4_4_ * auVar88._4_4_;
                auVar16._0_4_ = auVar10._0_4_ * auVar88._0_4_;
                auVar16._8_4_ = auVar10._8_4_ * auVar88._8_4_;
                auVar16._12_4_ = auVar10._12_4_ * auVar88._12_4_;
                auVar16._16_4_ = auVar10._16_4_ * 0.0;
                auVar16._20_4_ = auVar10._20_4_ * 0.0;
                auVar16._24_4_ = auVar10._24_4_ * 0.0;
                auVar16._28_4_ = auVar10._28_4_;
                auVar127._0_4_ = auVar49._0_4_ * auVar88._0_4_;
                auVar127._4_4_ = auVar49._4_4_ * auVar88._4_4_;
                auVar127._8_4_ = auVar49._8_4_ * auVar88._8_4_;
                auVar127._12_4_ = auVar49._12_4_ * auVar88._12_4_;
                auVar127._16_4_ = auVar49._16_4_ * 0.0;
                auVar127._20_4_ = auVar49._20_4_ * 0.0;
                auVar127._24_4_ = auVar49._24_4_ * 0.0;
                auVar127._28_4_ = 0;
                auVar10._4_4_ = fVar111 * auVar12._4_4_;
                auVar10._0_4_ = fVar111 * auVar12._0_4_;
                auVar10._8_4_ = fVar111 * auVar12._8_4_;
                auVar10._12_4_ = fVar111 * auVar12._12_4_;
                auVar10._16_4_ = fVar111 * auVar12._16_4_;
                auVar10._20_4_ = fVar111 * auVar12._20_4_;
                auVar10._24_4_ = fVar111 * auVar12._24_4_;
                auVar10._28_4_ = auVar49._28_4_;
                auVar48 = vfmsub231ps_fma(auVar10,auVar67,auVar115);
                auVar88 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar48),auVar9);
                auVar48 = vfmadd231ps_fma(auVar127,auVar93,ZEXT1632(auVar48));
                auVar17._4_4_ = auVar45._4_4_ * auVar9._4_4_;
                auVar17._0_4_ = auVar45._0_4_ * auVar9._0_4_;
                auVar17._8_4_ = auVar45._8_4_ * auVar9._8_4_;
                auVar17._12_4_ = auVar45._12_4_ * auVar9._12_4_;
                auVar17._16_4_ = auVar45._16_4_ * auVar9._16_4_;
                auVar17._20_4_ = auVar45._20_4_ * auVar9._20_4_;
                auVar17._24_4_ = auVar45._24_4_ * auVar9._24_4_;
                auVar17._28_4_ = auVar9._28_4_;
                auVar62 = vfmsub231ps_fma(auVar17,auVar50,auVar93);
                auVar9._4_4_ = fVar56 * auVar67._4_4_;
                auVar9._0_4_ = fVar56 * auVar67._0_4_;
                auVar9._8_4_ = fVar56 * auVar67._8_4_;
                auVar9._12_4_ = fVar56 * auVar67._12_4_;
                auVar9._16_4_ = fVar56 * auVar67._16_4_;
                auVar9._20_4_ = fVar56 * auVar67._20_4_;
                auVar9._24_4_ = fVar56 * auVar67._24_4_;
                auVar9._28_4_ = auVar93._28_4_;
                auVar44 = vfmsub231ps_fma(auVar9,auVar11,auVar125);
                fVar47 = auVar62._0_4_;
                fVar56 = auVar62._4_4_;
                auVar18._4_4_ = fVar111 * fVar56;
                auVar18._0_4_ = fVar111 * fVar47;
                fVar57 = auVar62._8_4_;
                auVar18._8_4_ = fVar111 * fVar57;
                fVar58 = auVar62._12_4_;
                auVar18._12_4_ = fVar111 * fVar58;
                auVar18._16_4_ = fVar111 * 0.0;
                auVar18._20_4_ = fVar111 * 0.0;
                auVar18._24_4_ = fVar111 * 0.0;
                auVar18._28_4_ = fVar111;
                auVar62 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar43),auVar122);
                auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),ZEXT1632(auVar84),auVar115);
                auVar107._8_4_ = 0x80000000;
                auVar107._0_8_ = 0x8000000080000000;
                auVar107._12_4_ = 0x80000000;
                auVar107._16_4_ = 0x80000000;
                auVar107._20_4_ = 0x80000000;
                auVar107._24_4_ = 0x80000000;
                auVar107._28_4_ = 0x80000000;
                auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar44),auVar50);
                auVar93 = vandps_avx(ZEXT1632(auVar62),auVar107);
                uVar31 = auVar93._0_4_;
                auVar102._0_4_ = (float)(uVar31 ^ auVar88._0_4_);
                uVar108 = auVar93._4_4_;
                auVar102._4_4_ = (float)(uVar108 ^ auVar88._4_4_);
                uVar109 = auVar93._8_4_;
                auVar102._8_4_ = (float)(uVar109 ^ auVar88._8_4_);
                uVar110 = auVar93._12_4_;
                auVar102._12_4_ = (float)(uVar110 ^ auVar88._12_4_);
                fVar111 = auVar93._16_4_;
                auVar102._16_4_ = fVar111;
                fVar112 = auVar93._20_4_;
                auVar102._20_4_ = fVar112;
                fVar113 = auVar93._24_4_;
                auVar102._24_4_ = fVar113;
                fVar59 = auVar93._28_4_;
                auVar102._28_4_ = fVar59;
                auVar88 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar45,ZEXT1632(auVar44));
                auVar105._0_4_ = (float)(uVar31 ^ auVar88._0_4_);
                auVar105._4_4_ = (float)(uVar108 ^ auVar88._4_4_);
                auVar105._8_4_ = (float)(uVar109 ^ auVar88._8_4_);
                auVar105._12_4_ = (float)(uVar110 ^ auVar88._12_4_);
                auVar105._16_4_ = fVar111;
                auVar105._20_4_ = fVar112;
                auVar105._24_4_ = fVar113;
                auVar105._28_4_ = fVar59;
                auVar93 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,5);
                auVar45 = vcmpps_avx(auVar105,ZEXT832(0) << 0x20,5);
                auVar93 = vandps_avx(auVar45,auVar93);
                auVar74._8_4_ = 0x7fffffff;
                auVar74._0_8_ = 0x7fffffff7fffffff;
                auVar74._12_4_ = 0x7fffffff;
                auVar74._16_4_ = 0x7fffffff;
                auVar74._20_4_ = 0x7fffffff;
                auVar74._24_4_ = 0x7fffffff;
                auVar74._28_4_ = 0x7fffffff;
                local_1240 = vandps_avx(ZEXT1632(auVar62),auVar74);
                auVar45 = vcmpps_avx(ZEXT1632(auVar62),ZEXT832(0) << 0x20,4);
                auVar93 = vandps_avx(auVar93,auVar45);
                auVar118._0_4_ = auVar102._0_4_ + auVar105._0_4_;
                auVar118._4_4_ = auVar102._4_4_ + auVar105._4_4_;
                auVar118._8_4_ = auVar102._8_4_ + auVar105._8_4_;
                auVar118._12_4_ = auVar102._12_4_ + auVar105._12_4_;
                auVar118._16_4_ = fVar111 + fVar111;
                auVar118._20_4_ = fVar112 + fVar112;
                auVar118._24_4_ = fVar113 + fVar113;
                auVar118._28_4_ = fVar59 + fVar59;
                auVar45 = vcmpps_avx(auVar118,local_1240,2);
                auVar49 = auVar45 & auVar93;
                if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar49 >> 0x7f,0) != '\0') ||
                      (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar49 >> 0xbf,0) != '\0') ||
                    (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar49[0x1f] < '\0') {
                  auVar93 = vandps_avx(auVar93,auVar45);
                  auVar88 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
                  auVar19._4_4_ = fVar56 * auVar67._4_4_;
                  auVar19._0_4_ = fVar47 * auVar67._0_4_;
                  auVar19._8_4_ = fVar57 * auVar67._8_4_;
                  auVar19._12_4_ = fVar58 * auVar67._12_4_;
                  auVar19._16_4_ = auVar67._16_4_ * 0.0;
                  auVar19._20_4_ = auVar67._20_4_ * 0.0;
                  auVar19._24_4_ = auVar67._24_4_ * 0.0;
                  auVar19._28_4_ = auVar67._28_4_;
                  auVar48 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar43),auVar19);
                  auVar48 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar84),ZEXT1632(auVar48));
                  local_1260._0_4_ = (float)(uVar31 ^ auVar48._0_4_);
                  local_1260._4_4_ = (float)(uVar108 ^ auVar48._4_4_);
                  local_1260._8_4_ = (float)(uVar109 ^ auVar48._8_4_);
                  local_1260._12_4_ = (float)(uVar110 ^ auVar48._12_4_);
                  local_1260._16_4_ = fVar111;
                  local_1260._20_4_ = fVar112;
                  local_1260._24_4_ = fVar113;
                  local_1260._28_4_ = fVar59;
                  fVar59 = *(float *)(ray + k * 4 + 0x60);
                  fVar70 = local_1240._0_4_;
                  fVar75 = local_1240._4_4_;
                  auVar12._4_4_ = fVar75 * fVar59;
                  auVar12._0_4_ = fVar70 * fVar59;
                  fVar77 = local_1240._8_4_;
                  auVar12._8_4_ = fVar77 * fVar59;
                  fVar79 = local_1240._12_4_;
                  auVar12._12_4_ = fVar79 * fVar59;
                  fVar81 = local_1240._16_4_;
                  auVar12._16_4_ = fVar81 * fVar59;
                  fVar82 = local_1240._20_4_;
                  auVar12._20_4_ = fVar82 * fVar59;
                  fVar83 = local_1240._24_4_;
                  auVar12._24_4_ = fVar83 * fVar59;
                  auVar12._28_4_ = fVar59;
                  auVar93 = vcmpps_avx(auVar12,local_1260,1);
                  auVar11._4_4_ = fVar61 * fVar75;
                  auVar11._0_4_ = fVar61 * fVar70;
                  auVar11._8_4_ = fVar61 * fVar77;
                  auVar11._12_4_ = fVar61 * fVar79;
                  auVar11._16_4_ = fVar61 * fVar81;
                  auVar11._20_4_ = fVar61 * fVar82;
                  auVar11._24_4_ = fVar61 * fVar83;
                  auVar11._28_4_ = fVar61;
                  auVar45 = vcmpps_avx(local_1260,auVar11,2);
                  auVar93 = vandps_avx(auVar45,auVar93);
                  auVar48 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
                  auVar88 = vpand_avx(auVar88,auVar48);
                  auVar93 = vpmovzxwd_avx2(auVar88);
                  auVar93 = vpslld_avx2(auVar93,0x1f);
                  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar93 >> 0x7f,0) != '\0') ||
                        (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar93 >> 0xbf,0) != '\0') ||
                      (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar93[0x1f] < '\0') {
                    local_1200 = vpsrad_avx2(auVar93,0x1f);
                    auVar45 = vsubps_avx(local_1240,auVar105);
                    auVar45 = vblendvps_avx(auVar102,auVar45,local_1100);
                    auVar49 = vsubps_avx(local_1240,auVar102);
                    local_1280 = vblendvps_avx(auVar105,auVar49,local_1100);
                    local_1180._0_4_ = (float)local_1120._0_4_ * auVar84._0_4_;
                    local_1180._4_4_ = (float)local_1120._4_4_ * auVar84._4_4_;
                    local_1180._8_4_ = fStack_1118 * auVar84._8_4_;
                    local_1180._12_4_ = fStack_1114 * auVar84._12_4_;
                    local_1180._16_4_ = fStack_1110 * 0.0;
                    local_1180._20_4_ = fStack_110c * 0.0;
                    local_1180._24_4_ = fStack_1108 * 0.0;
                    local_1180._28_4_ = 0;
                    local_1160._4_4_ = (float)local_1120._4_4_ * auVar43._4_4_;
                    local_1160._0_4_ = (float)local_1120._0_4_ * auVar43._0_4_;
                    local_1160._8_4_ = fStack_1118 * auVar43._8_4_;
                    local_1160._12_4_ = fStack_1114 * auVar43._12_4_;
                    local_1160._16_4_ = fStack_1110 * 0.0;
                    local_1160._20_4_ = fStack_110c * 0.0;
                    local_1160._24_4_ = fStack_1108 * 0.0;
                    local_1160._28_4_ = 0;
                    local_1140._4_4_ = (float)local_1120._4_4_ * fVar56;
                    local_1140._0_4_ = (float)local_1120._0_4_ * fVar47;
                    local_1140._8_4_ = fStack_1118 * fVar57;
                    local_1140._12_4_ = fStack_1114 * fVar58;
                    local_1140._16_4_ = fStack_1110 * 0.0;
                    local_1140._20_4_ = fStack_110c * 0.0;
                    local_1140._24_4_ = fStack_1108 * 0.0;
                    local_1140._28_4_ = 0;
                    auVar66._0_4_ = (float)(int)(*(ushort *)(lVar24 + 8 + lVar37) - 1);
                    auVar66._4_12_ = auVar43._4_12_;
                    auVar52._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                    auVar52._8_4_ = uVar32;
                    auVar52._12_4_ = uVar32;
                    auVar52._16_4_ = uVar32;
                    auVar52._20_4_ = uVar32;
                    auVar52._24_4_ = uVar32;
                    auVar52._28_4_ = uVar32;
                    auVar49 = vpaddd_avx2(auVar52,_DAT_01fec4a0);
                    auVar88 = vrcpss_avx(auVar66,auVar66);
                    auVar48 = vfnmadd213ss_fma(auVar88,auVar66,ZEXT416(0x40000000));
                    fVar61 = auVar48._0_4_ * auVar88._0_4_;
                    auVar49 = vcvtdq2ps_avx(auVar49);
                    fStack_11c4 = auVar45._28_4_ + auVar49._28_4_;
                    fVar47 = (auVar45._0_4_ + fVar70 * auVar49._0_4_) * fVar61;
                    fVar56 = (auVar45._4_4_ + fVar75 * auVar49._4_4_) * fVar61;
                    local_12a0._4_4_ = fVar56;
                    local_12a0._0_4_ = fVar47;
                    fVar57 = (auVar45._8_4_ + fVar77 * auVar49._8_4_) * fVar61;
                    local_12a0._8_4_ = fVar57;
                    fVar58 = (auVar45._12_4_ + fVar79 * auVar49._12_4_) * fVar61;
                    local_12a0._12_4_ = fVar58;
                    fVar59 = (auVar45._16_4_ + fVar81 * auVar49._16_4_) * fVar61;
                    local_12a0._16_4_ = fVar59;
                    fVar60 = (auVar45._20_4_ + fVar82 * auVar49._20_4_) * fVar61;
                    local_12a0._20_4_ = fVar60;
                    fVar61 = (auVar45._24_4_ + fVar83 * auVar49._24_4_) * fVar61;
                    local_12a0._24_4_ = fVar61;
                    local_12a0._28_4_ = fStack_11c4;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar69._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                      auVar69._8_4_ = uVar33;
                      auVar69._12_4_ = uVar33;
                      auVar69._16_4_ = uVar33;
                      auVar69._20_4_ = uVar33;
                      auVar69._24_4_ = uVar33;
                      auVar69._28_4_ = uVar33;
                      auVar45 = vpaddd_avx2(auVar69,_DAT_01fec4c0);
                      auVar45 = vcvtdq2ps_avx(auVar45);
                      auVar95._0_4_ = (float)(int)(*(ushort *)(lVar24 + 10 + lVar37) - 1);
                      auVar95._4_12_ = auVar120._4_12_;
                      auVar88 = vrcpss_avx(auVar95,auVar95);
                      auVar48 = vfnmadd213ss_fma(auVar88,auVar95,ZEXT416(0x40000000));
                      fVar8 = auVar48._0_4_ * auVar88._0_4_;
                      auVar49 = vrcpps_avx(local_1240);
                      auVar97._8_4_ = 0x3f800000;
                      auVar97._0_8_ = 0x3f8000003f800000;
                      auVar97._12_4_ = 0x3f800000;
                      auVar97._16_4_ = 0x3f800000;
                      auVar97._20_4_ = 0x3f800000;
                      auVar97._24_4_ = 0x3f800000;
                      auVar97._28_4_ = 0x3f800000;
                      auVar88 = vfnmadd213ps_fma(local_1240,auVar49,auVar97);
                      auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar49,auVar49);
                      fVar71 = auVar88._0_4_;
                      fVar76 = auVar88._4_4_;
                      local_13a0._4_4_ = fVar76 * local_1260._4_4_;
                      local_13a0._0_4_ = fVar71 * local_1260._0_4_;
                      fVar78 = auVar88._8_4_;
                      local_13a0._8_4_ = fVar78 * local_1260._8_4_;
                      fVar80 = auVar88._12_4_;
                      local_13a0._12_4_ = fVar80 * local_1260._12_4_;
                      local_13a0._16_4_ = fVar111 * 0.0;
                      local_13a0._20_4_ = fVar112 * 0.0;
                      local_13a0._24_4_ = fVar113 * 0.0;
                      local_13a0._28_4_ = 0x3f800000;
                      auVar98 = ZEXT3264(local_13a0);
                      local_11a0 = local_13a0;
                      local_11e0[0] = fVar47 * fVar71;
                      local_11e0[1] = fVar56 * fVar76;
                      local_11e0[2] = fVar57 * fVar78;
                      local_11e0[3] = fVar58 * fVar80;
                      fStack_11d0 = fVar59 * 0.0;
                      fStack_11cc = fVar60 * 0.0;
                      fStack_11c8 = fVar61 * 0.0;
                      local_11c0[0] = (fVar70 * auVar45._0_4_ + local_1280._0_4_) * fVar8 * fVar71;
                      local_11c0[1] = (fVar75 * auVar45._4_4_ + local_1280._4_4_) * fVar8 * fVar76;
                      local_11c0[2] = (fVar77 * auVar45._8_4_ + local_1280._8_4_) * fVar8 * fVar78;
                      local_11c0[3] = (fVar79 * auVar45._12_4_ + local_1280._12_4_) * fVar8 * fVar80
                      ;
                      fStack_11b0 = (fVar81 * auVar45._16_4_ + local_1280._16_4_) * fVar8 * 0.0;
                      fStack_11ac = (fVar82 * auVar45._20_4_ + local_1280._20_4_) * fVar8 * 0.0;
                      fStack_11a8 = (fVar83 * auVar45._24_4_ + local_1280._24_4_) * fVar8 * 0.0;
                      fStack_11a4 = fStack_11c4;
                      auVar53._8_4_ = 0x7f800000;
                      auVar53._0_8_ = 0x7f8000007f800000;
                      auVar53._12_4_ = 0x7f800000;
                      auVar53._16_4_ = 0x7f800000;
                      auVar53._20_4_ = 0x7f800000;
                      auVar53._24_4_ = 0x7f800000;
                      auVar53._28_4_ = 0x7f800000;
                      auVar45 = vblendvps_avx(auVar53,local_13a0,auVar93);
                      auVar49 = vshufps_avx(auVar45,auVar45,0xb1);
                      auVar49 = vminps_avx(auVar45,auVar49);
                      auVar50 = vshufpd_avx(auVar49,auVar49,5);
                      auVar49 = vminps_avx(auVar49,auVar50);
                      auVar50 = vpermpd_avx2(auVar49,0x4e);
                      auVar49 = vminps_avx(auVar49,auVar50);
                      auVar49 = vcmpps_avx(auVar45,auVar49,0);
                      auVar50 = local_1200 & auVar49;
                      auVar45 = local_1200;
                      if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar50 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar50 >> 0x7f,0) != '\0') ||
                            (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar50 >> 0xbf,0) != '\0') ||
                          (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar50[0x1f] < '\0') {
                        auVar45 = vandps_avx(auVar49,local_1200);
                      }
                      uVar32 = vmovmskps_avx(auVar45);
                      uVar31 = 0;
                      for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                        uVar31 = uVar31 + 1;
                      }
                      uVar36 = (ulong)uVar31;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar61 = local_11e0[uVar36];
                        fVar47 = local_11c0[uVar36];
                        uVar22 = *(undefined4 *)(local_1180 + uVar36 * 4);
                        uVar26 = *(undefined4 *)(local_1160 + uVar36 * 4);
                        uVar2 = *(undefined4 *)(local_1140 + uVar36 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_11a0 + uVar36 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar22;
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar26;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar2;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar61;
                        *(float *)(ray + k * 4 + 0x200) = fVar47;
                        *(uint *)(ray + k * 4 + 0x220) = uStack_1378;
                        *(uint *)(ray + k * 4 + 0x240) = uStack_1358;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_1360 = CONCAT44(uStack_1358,uStack_1358);
                        local_1380 = CONCAT44(uStack_1378,uStack_1378);
                        uVar22 = *(undefined4 *)(ray + k * 4 + 0x100);
                        auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
                        auVar100 = ZEXT3264(auVar93);
                        uStack_1374 = uStack_1378;
                        uStack_1370 = uStack_1378;
                        uStack_136c = uStack_1378;
                        uStack_1368 = uStack_1378;
                        uStack_1364 = uStack_1378;
                        uStack_1354 = uStack_1358;
                        uStack_1350 = uStack_1358;
                        uStack_134c = uStack_1358;
                        uStack_1348 = uStack_1358;
                        uStack_1344 = uStack_1358;
                        local_1340 = local_1200;
                        while( true ) {
                          local_1060 = local_11e0[uVar36];
                          local_1040 = local_11c0[uVar36];
                          *(undefined4 *)(ray + k * 4 + 0x100) =
                               *(undefined4 *)(local_11a0 + uVar36 * 4);
                          local_10c0 = *(undefined4 *)(local_1180 + uVar36 * 4);
                          uVar26 = *(undefined4 *)(local_1160 + uVar36 * 4);
                          local_10a0._4_4_ = uVar26;
                          local_10a0._0_4_ = uVar26;
                          local_10a0._8_4_ = uVar26;
                          local_10a0._12_4_ = uVar26;
                          local_10a0._16_4_ = uVar26;
                          local_10a0._20_4_ = uVar26;
                          local_10a0._24_4_ = uVar26;
                          local_10a0._28_4_ = uVar26;
                          uVar26 = *(undefined4 *)(local_1140 + uVar36 * 4);
                          local_1080._4_4_ = uVar26;
                          local_1080._0_4_ = uVar26;
                          local_1080._8_4_ = uVar26;
                          local_1080._12_4_ = uVar26;
                          local_1080._16_4_ = uVar26;
                          local_1080._20_4_ = uVar26;
                          local_1080._24_4_ = uVar26;
                          local_1080._28_4_ = uVar26;
                          local_13f0.context = context->user;
                          uStack_10bc = local_10c0;
                          uStack_10b8 = local_10c0;
                          uStack_10b4 = local_10c0;
                          uStack_10b0 = local_10c0;
                          uStack_10ac = local_10c0;
                          uStack_10a8 = local_10c0;
                          uStack_10a4 = local_10c0;
                          fStack_105c = local_1060;
                          fStack_1058 = local_1060;
                          fStack_1054 = local_1060;
                          fStack_1050 = local_1060;
                          fStack_104c = local_1060;
                          fStack_1048 = local_1060;
                          fStack_1044 = local_1060;
                          fStack_103c = local_1040;
                          fStack_1038 = local_1040;
                          fStack_1034 = local_1040;
                          fStack_1030 = local_1040;
                          fStack_102c = local_1040;
                          fStack_1028 = local_1040;
                          fStack_1024 = local_1040;
                          local_1020 = local_1380;
                          uStack_1018 = CONCAT44(uStack_1374,uStack_1378);
                          uStack_1010 = CONCAT44(uStack_136c,uStack_1370);
                          uStack_1008 = CONCAT44(uStack_1364,uStack_1368);
                          local_1000 = local_1360;
                          uStack_ff8 = CONCAT44(uStack_1354,uStack_1358);
                          uStack_ff0 = CONCAT44(uStack_134c,uStack_1350);
                          uStack_fe8 = CONCAT44(uStack_1344,uStack_1348);
                          uStack_fdc = (local_13f0.context)->instID[0];
                          local_fe0 = uStack_fdc;
                          uStack_fd8 = uStack_fdc;
                          uStack_fd4 = uStack_fdc;
                          uStack_fd0 = uStack_fdc;
                          uStack_fcc = uStack_fdc;
                          uStack_fc8 = uStack_fdc;
                          uStack_fc4 = uStack_fdc;
                          uStack_fbc = (local_13f0.context)->instPrimID[0];
                          local_fc0 = uStack_fbc;
                          uStack_fb8 = uStack_fbc;
                          uStack_fb4 = uStack_fbc;
                          uStack_fb0 = uStack_fbc;
                          uStack_fac = uStack_fbc;
                          uStack_fa8 = uStack_fbc;
                          uStack_fa4 = uStack_fbc;
                          local_1320 = local_10e0;
                          local_13f0.valid = (int *)local_1320;
                          local_13f0.geometryUserPtr = pGVar5->userPtr;
                          local_13f0.hit = (RTCHitN *)&local_10c0;
                          local_13f0.N = 8;
                          local_13f0.ray = (RTCRayN *)ray;
                          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar93 = ZEXT1632(auVar100._0_16_);
                            (*pGVar5->intersectionFilterN)(&local_13f0);
                            auVar98 = ZEXT3264(local_13a0);
                            auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
                            auVar100 = ZEXT3264(auVar93);
                          }
                          auVar45 = vpcmpeqd_avx2(local_1320,_DAT_01faff00);
                          auVar93 = auVar100._0_32_ & ~auVar45;
                          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar93 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar93 >> 0x7f,0) == '\0') &&
                                (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar93 >> 0xbf,0) == '\0') &&
                              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar93[0x1f]) {
                            auVar45 = auVar45 ^ auVar100._0_32_;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar93 = ZEXT1632(auVar100._0_16_);
                              (*p_Var6)(&local_13f0);
                              auVar98 = ZEXT3264(local_13a0);
                              auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
                              auVar100 = ZEXT3264(auVar93);
                            }
                            auVar49 = vpcmpeqd_avx2(local_1320,_DAT_01faff00);
                            auVar45 = auVar49 ^ auVar100._0_32_;
                            auVar93 = auVar100._0_32_ & ~auVar49;
                            if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar93 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar93 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar93 >> 0x7f,0) != '\0') ||
                                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar93 >> 0xbf,0) != '\0') ||
                                (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar93[0x1f] < '\0') {
                              auVar54._0_4_ = auVar49._0_4_ ^ auVar100._0_4_;
                              auVar54._4_4_ = auVar49._4_4_ ^ auVar100._4_4_;
                              auVar54._8_4_ = auVar49._8_4_ ^ auVar100._8_4_;
                              auVar54._12_4_ = auVar49._12_4_ ^ auVar100._12_4_;
                              auVar54._16_4_ = auVar49._16_4_ ^ auVar100._16_4_;
                              auVar54._20_4_ = auVar49._20_4_ ^ auVar100._20_4_;
                              auVar54._24_4_ = auVar49._24_4_ ^ auVar100._24_4_;
                              auVar54._28_4_ = auVar49._28_4_ ^ auVar100._28_4_;
                              auVar93 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])local_13f0.hit)
                              ;
                              *(undefined1 (*) [32])(local_13f0.ray + 0x180) = auVar93;
                              auVar93 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                                (local_13f0.hit + 0x20));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x1a0) = auVar93;
                              auVar93 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                                (local_13f0.hit + 0x40));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x1c0) = auVar93;
                              auVar93 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                                (local_13f0.hit + 0x60));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x1e0) = auVar93;
                              auVar93 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                                (local_13f0.hit + 0x80));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x200) = auVar93;
                              auVar93 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                                 (local_13f0.hit + 0xa0));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x220) = auVar93;
                              auVar93 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                                 (local_13f0.hit + 0xc0));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x240) = auVar93;
                              auVar93 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                                 (local_13f0.hit + 0xe0));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x260) = auVar93;
                              auVar93 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                                 (local_13f0.hit + 0x100));
                              *(undefined1 (*) [32])(local_13f0.ray + 0x280) = auVar93;
                            }
                          }
                          if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar45 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar45 >> 0x7f,0) == '\0') &&
                                (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar45 >> 0xbf,0) == '\0') &&
                              (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar45[0x1f]) {
                            *(undefined4 *)(ray + k * 4 + 0x100) = uVar22;
                          }
                          else {
                            uVar22 = *(undefined4 *)(ray + k * 4 + 0x100);
                          }
                          *(undefined4 *)(local_1340 + uVar36 * 4) = 0;
                          auVar46._4_4_ = uVar22;
                          auVar46._0_4_ = uVar22;
                          auVar46._8_4_ = uVar22;
                          auVar46._12_4_ = uVar22;
                          auVar46._16_4_ = uVar22;
                          auVar46._20_4_ = uVar22;
                          auVar46._24_4_ = uVar22;
                          auVar46._28_4_ = uVar22;
                          auVar45 = vcmpps_avx(auVar98._0_32_,auVar46,2);
                          auVar93 = vandps_avx(auVar45,local_1340);
                          local_1340 = local_1340 & auVar45;
                          if ((((((((local_1340 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_1340 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_1340 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_1340 >> 0x7f,0) == '\0') &&
                                (local_1340 & (undefined1  [32])0x100000000) ==
                                (undefined1  [32])0x0) && SUB321(local_1340 >> 0xbf,0) == '\0') &&
                              (local_1340 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < local_1340[0x1f]) break;
                          auVar55._8_4_ = 0x7f800000;
                          auVar55._0_8_ = 0x7f8000007f800000;
                          auVar55._12_4_ = 0x7f800000;
                          auVar55._16_4_ = 0x7f800000;
                          auVar55._20_4_ = 0x7f800000;
                          auVar55._24_4_ = 0x7f800000;
                          auVar55._28_4_ = 0x7f800000;
                          auVar45 = vblendvps_avx(auVar55,auVar98._0_32_,auVar93);
                          auVar49 = vshufps_avx(auVar45,auVar45,0xb1);
                          auVar49 = vminps_avx(auVar45,auVar49);
                          auVar50 = vshufpd_avx(auVar49,auVar49,5);
                          auVar49 = vminps_avx(auVar49,auVar50);
                          auVar50 = vpermpd_avx2(auVar49,0x4e);
                          auVar49 = vminps_avx(auVar49,auVar50);
                          auVar49 = vcmpps_avx(auVar45,auVar49,0);
                          auVar50 = auVar93 & auVar49;
                          auVar45 = auVar93;
                          if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar50 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar50 >> 0x7f,0) != '\0') ||
                                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar50 >> 0xbf,0) != '\0') ||
                              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar50[0x1f] < '\0') {
                            auVar45 = vandps_avx(auVar49,auVar93);
                          }
                          uVar32 = vmovmskps_avx(auVar45);
                          uVar31 = 0;
                          for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                            uVar31 = uVar31 + 1;
                          }
                          uVar36 = (ulong)uVar31;
                          local_1340 = auVar93;
                        }
                      }
                    }
                  }
                }
                auVar103 = ZEXT1664(local_12d0);
                auVar106 = ZEXT1664(local_12c0);
                auVar116 = ZEXT1664(local_12e0);
                auVar119 = ZEXT1664(local_12f0);
                auVar123 = ZEXT1664(local_1300);
              }
              uVar29 = uVar29 - 1 & uVar29;
            } while (uVar29 != 0);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != uVar27 - 8);
      }
      uVar22 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar106 = ZEXT1664(CONCAT412(uVar22,CONCAT48(uVar22,CONCAT44(uVar22,uVar22))));
      auVar98 = ZEXT1664(local_13b0);
      auVar100 = ZEXT1664(local_13c0);
    }
    if (pauVar23 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }